

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

wchar_t * archive_entry_gname_w(archive_entry *entry)

{
  wchar_t wVar1;
  wchar_t *in_RAX;
  int *piVar2;
  wchar_t *p;
  wchar_t *local_8;
  
  local_8 = in_RAX;
  wVar1 = archive_mstring_get_wcs(entry->archive,&entry->ae_gname,&local_8);
  if (wVar1 != L'\0') {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
    local_8 = (wchar_t *)0x0;
  }
  return local_8;
}

Assistant:

const wchar_t *
archive_entry_gname_w(struct archive_entry *entry)
{
	const wchar_t *p;
	if (archive_mstring_get_wcs(entry->archive, &entry->ae_gname, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}